

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::doCreate(Forth *this)

{
  Cell index;
  Definition *pDVar1;
  
  index = this->executingWord;
  pDVar1 = definitionsAt(this,index);
  requireDStackAvailable(this,1,(pDVar1->name)._M_dataplus._M_p);
  pDVar1 = definitionsAt(this,index);
  ForthStack<unsigned_int>::push(&this->dStack,pDVar1->parameter);
  return;
}

Assistant:

void doCreate() {
			auto defn = executingWord;
			REQUIRE_DSTACK_AVAILABLE(1, definitionsAt(defn).name.c_str());
			push(CELL(definitionsAt(defn).parameter)); 
		}